

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall Catch::Clara::Parser::handleNone(Parser *this,size_t i,char c)

{
  char c_local;
  size_t i_local;
  Parser *this_local;
  
  if ((this->inQuotes & 1U) == 0) {
    if (c == '-') {
      this_local._4_4_ = MaybeShortOpt;
    }
    else {
      this->from = i;
      this_local._4_4_ = Positional;
    }
  }
  else {
    this->from = i;
    this_local._4_4_ = Positional;
  }
  return this_local._4_4_;
}

Assistant:

Mode handleNone( std::size_t i, char c ) {
            if( inQuotes ) {
                from = i;
                return Positional;
            }
            switch( c ) {
                case '-': return MaybeShortOpt;
#ifdef CLARA_PLATFORM_WINDOWS
                case '/': from = i+1; return SlashOpt;
#endif
                default: from = i; return Positional;
            }
        }